

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O3

Var Js::Math::FloorDouble(double d,ScriptContext *scriptContext)

{
  bool bVar1;
  Var pvVar2;
  ulong uVar3;
  undefined8 in_XMM0_Qb;
  undefined1 in_XMM1 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double value;
  undefined1 auVar6 [16];
  
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = d;
  auVar4 = roundsd(in_XMM1,auVar4,9);
  auVar5._0_8_ = auVar4._0_8_ & -(ulong)(d < 0.0);
  auVar5._8_8_ = 0;
  auVar6._0_8_ = ~-(ulong)(d < 0.0) & (ulong)d;
  auVar6._8_8_ = in_XMM0_Qb;
  value = SUB168(auVar6 | auVar5,0);
  uVar3 = (ulong)value;
  if ((long)(int)uVar3 == uVar3) {
    bVar1 = NumberUtilities::IsSpecial(value,0x8000000000000000);
    if (!bVar1) {
      return (Var)(uVar3 & 0xffffffff | 0x1000000000000);
    }
  }
  auVar4 = roundsd(ZEXT816(0),auVar6 | auVar5,9);
  pvVar2 = JavascriptNumber::ToVarNoCheck(auVar4._0_8_,scriptContext);
  return pvVar2;
}

Assistant:

Var inline Math::FloorDouble(double d, ScriptContext *scriptContext)
    {
            // xplat-todo: use intrinsics here on linux
#ifdef _MSC_VER
#if defined(_M_IX86) || defined(_M_X64)
        if (AutoSystemInfo::Data.SSE4_1Available())
        {
            __m128d input, output;

            int intResult;

            input = _mm_load_sd(&d);
            if (d >= 0.0)
            {
                output = input;
            }
            else
            {
                output = _mm_floor_sd(input, input);
            }
            intResult = _mm_cvttsd_si32(output);

            if (TaggedInt::IsOverflow(intResult) || intResult == 0x80000000 || JavascriptNumber::IsNegZero(d))
            {
                double dblResult;
                if (d >= 0.0)
                {
                    output = _mm_floor_sd(output, input);
                }
                _mm_store_sd(&dblResult, output);

                Assert(dblResult == ::floor(d) || Js::JavascriptNumber::IsNan(dblResult));

                return JavascriptNumber::ToVarNoCheck(dblResult, scriptContext);
            }
            else
            {
                Assert(intResult == (int)::floor(d));
                return JavascriptNumber::ToVar(intResult, scriptContext);
            }
        }
        else
#endif
#endif
        {
            intptr_t intResult;

            if (d >= 0.0)
            {
                intResult = (intptr_t)d;
            }
            else
            {
                d = ::floor(d);
                intResult = (intptr_t)d;
            }

            if (TaggedInt::IsOverflow(intResult) || JavascriptNumber::IsNegZero(d))
            {
                return JavascriptNumber::ToVarNoCheck(::floor(d), scriptContext);
            }
            else
            {
                return JavascriptNumber::ToVar(intResult, scriptContext);
            }
        }
    }